

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O1

bool stl_reader::
     ReadStlFile_ASCII<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  pointer pfVar1;
  pointer puVar2;
  iterator iVar3;
  iterator __position;
  double dVar4;
  ArrayAnnex<unsigned_int> *pAVar5;
  pointer pbVar6;
  pointer pbVar7;
  char cVar8;
  int iVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  size_type __new_size;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  string buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  stringstream ss;
  istringstream line;
  ifstream in;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  local_5e8;
  ArrayAnnex<unsigned_int> *local_5d0;
  long local_5c8;
  string local_5c0 [32];
  undefined1 *local_5a0;
  undefined8 local_598;
  undefined1 local_590;
  undefined7 uStack_58f;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_580;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_560;
  ArrayAnnex<unsigned_int> *local_558;
  ArrayAnnex<float> *local_550;
  vector<float,std::allocator<float>> *local_548;
  CoordWithIndex<float,_unsigned_int> local_540;
  ostream local_530 [376];
  long local_3b8 [4];
  byte abStack_398 [88];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  pfVar1 = (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  puVar2 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  local_5d0 = trisOut;
  local_550 = coordsOut;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
    std::__ostream_insert<char,std::char_traits<char>>(local_530,"Couldn\'t open file ",0x13);
    std::operator<<(local_530,filename);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)local_3b8);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_560 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&solidRangesOut->m_vector;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (CoordWithIndex<float,_unsigned_int> *)0x0;
  __new_size = 0;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (CoordWithIndex<float,_unsigned_int> *)0x0;
  local_5a0 = &local_590;
  local_598 = 0;
  local_590 = 0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558 = solidRangesOut;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 7) == 0) {
    local_548 = (vector<float,std::allocator<float>> *)&normalsOut->m_vector;
    local_580 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&local_5d0->m_vector;
    lVar15 = (long)local_238 + *(long *)(local_238[0] + -0x18);
    iVar12 = 1;
    local_5c8 = 0;
    do {
      cVar8 = std::ios::widen((char)lVar15);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_5a0,cVar8);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_5a0,_S_in);
      lVar15 = 0;
      if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 7) == 0) {
        lVar13 = 0;
        lVar15 = 0;
        do {
          if ((int)__new_size <= lVar15) {
            __new_size = lVar15 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize(&local_578,__new_size);
          }
          std::operator>>((istream *)local_3b8,
                          (string *)
                          ((long)&((local_578.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar13));
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 7) == 0);
      }
      pbVar6 = local_578.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (uint)lVar15;
      if (uVar14 != 0) {
        iVar9 = std::__cxx11::string::compare
                          ((char *)local_578.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        pbVar7 = local_578.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar9 == 0) {
          if (uVar14 < 4) {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_530,"ERROR while reading from ",0x19);
            poVar10 = std::operator<<(local_530,filename);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,": vertex not specified correctly in line ",0x29);
            std::ostream::operator<<((ostream *)poVar10,iVar12);
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar11,local_5c0);
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar15 = 0;
          do {
            dVar4 = atof((&pbVar7[1]._M_dataplus)[lVar15]._M_p);
            *(float *)((long)local_540.data + lVar15) = (float)dVar4;
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0xc);
          local_540.index =
               (uint)((ulong)((long)local_5e8.
                                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5e8.
                                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
          if (local_5e8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_5e8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
            ::
            _M_realloc_insert<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>const&>
                      ((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
                        *)&local_5e8,
                       (iterator)
                       local_5e8.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_540);
          }
          else {
            *(ulong *)(local_5e8.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->data =
                 CONCAT44(local_540.data[1],local_540.data[0]);
            *(ulong *)((local_5e8.
                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data + 2) =
                 CONCAT44(local_540.index,local_540.data[2]);
            local_5e8.
            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_5e8.
                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_5c8 = local_5c8 + 1;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)pbVar6);
          if (iVar9 == 0) {
            if (uVar14 < 5) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_530,"ERROR while reading from ",0x19);
              poVar10 = std::operator<<(local_530,filename);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,": triangle not specified correctly in line ",0x2b);
              std::ostream::operator<<((ostream *)poVar10,iVar12);
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar11,local_5c0);
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar9 = std::__cxx11::string::compare
                              ((char *)(local_578.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
            if (iVar9 != 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_530,"ERROR while reading from ",0x19);
              poVar10 = std::operator<<(local_530,filename);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,": Missing normal specifier in line ",0x23);
              std::ostream::operator<<((ostream *)poVar10,iVar12);
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar11,local_5c0);
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar15 = 0;
            do {
              dVar4 = atof(*(char **)((long)&local_578.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].
                                             _M_dataplus._M_p + lVar15));
              local_540.data[0] = (float)dVar4;
              __position._M_current =
                   (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          (local_548,__position,local_540.data);
              }
              else {
                *__position._M_current = local_540.data[0];
                (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              lVar15 = lVar15 + 0x20;
            } while (lVar15 != 0x60);
            local_5c8 = 0;
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)pbVar6);
            if (iVar9 == 0) {
              if ((uVar14 == 1) ||
                 (iVar9 = std::__cxx11::string::compare
                                    ((char *)(local_578.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1)),
                 iVar9 != 0)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_530,"ERROR while reading from ",0x19);
                poVar10 = std::operator<<(local_530,filename);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,": expecting outer loop in line ",0x1f);
                std::ostream::operator<<((ostream *)poVar10,iVar12);
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar11,local_5c0);
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)pbVar6);
              pAVar5 = local_5d0;
              if (iVar9 == 0) {
                if (local_5c8 != 3) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_530,"ERROR while reading from ",0x19);
                  poVar10 = std::operator<<(local_530,filename);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,": bad number of vertices specified for face in line ",0x34);
                  std::ostream::operator<<((ostream *)poVar10,iVar12);
                  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar11,local_5c0);
                  __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_540.data[0] =
                     (float)((int)((ulong)((long)local_5e8.
                                                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_5e8.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) - 3
                            );
                iVar3._M_current =
                     (local_5d0->m_vector).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (local_5d0->m_vector).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_580,iVar3,(uint *)&local_540);
                }
                else {
                  *iVar3._M_current = (uint)local_540.data[0];
                  (local_5d0->m_vector).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                local_540.data[0] =
                     (float)((int)((ulong)((long)local_5e8.
                                                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_5e8.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) - 2
                            );
                iVar3._M_current =
                     (pAVar5->m_vector).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pAVar5->m_vector).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_580,iVar3,(uint *)&local_540);
                }
                else {
                  *iVar3._M_current = (uint)local_540.data[0];
                  (pAVar5->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                local_540.data[0] =
                     (float)((int)((ulong)((long)local_5e8.
                                                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_5e8.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1
                            );
                iVar3._M_current =
                     (pAVar5->m_vector).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pAVar5->m_vector).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_580,iVar3,(uint *)&local_540);
                }
                else {
                  *iVar3._M_current = (uint)local_540.data[0];
                  (pAVar5->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                local_5c8 = 3;
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)pbVar6);
                if (iVar9 == 0) {
                  local_540.data[0] =
                       (float)(((ulong)((long)(local_5d0->m_vector).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_5d0->m_vector).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                               0xffffffff) / 3);
                  iVar3._M_current =
                       (local_558->m_vector).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (local_558->m_vector).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>(local_560,iVar3,(uint *)&local_540);
                  }
                  else {
                    *iVar3._M_current = (uint)local_540.data[0];
                    (local_558->m_vector).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                }
              }
            }
          }
        }
      }
      iVar12 = iVar12 + 1;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      lVar15 = (long)local_238 + *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 7) == 0);
  }
  pAVar5 = local_5d0;
  local_540.data[0] =
       (float)(((ulong)((long)(local_5d0->m_vector).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_5d0->m_vector).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2 & 0xffffffff) / 3);
  iVar3._M_current =
       (local_558->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (local_558->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (local_560,iVar3,(uint *)&local_540);
  }
  else {
    *iVar3._M_current = (uint)local_540.data[0];
    (local_558->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
            (local_550,pAVar5,&local_5e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578);
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,CONCAT71(uStack_58f,local_590) + 1);
  }
  if (local_5e8.
      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.
                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.
                          super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.
                          super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return true;
}

Assistant:

bool ReadStlFile_ASCII(const char* filename,
                       TNumberContainer1& coordsOut,
                       TNumberContainer2& normalsOut,
                       TIndexContainer1& trisOut,
					   TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldn't open file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	string buffer;
	vector<string> tokens;
	int lineCount = 1;
	int maxNumTokens = 0;
	size_t numFaceVrts = 0;

	while(!(in.eof() || in.fail()))
	{
	//	read the line and tokenize.
	//	In order to reuse memory in between lines, 'tokens' won't be cleared.
	//	Instead we count the number of tokens using 'tokenCount'.
		getline(in, buffer);

		istringstream line(buffer);
		int tokenCount = 0;
		while(!(line.eof() || line.fail())){
			if(tokenCount >= maxNumTokens){
				maxNumTokens = tokenCount + 1;
				tokens.resize(maxNumTokens);
			}
			line >> tokens[tokenCount];
			++tokenCount;
		}

		if(tokenCount > 0)
		{
			string& tok = tokens[0];
			if(tok.compare("vertex") == 0){
				if(tokenCount < 4){
					STL_READER_THROW("ERROR while reading from " << filename <<
						": vertex not specified correctly in line " << lineCount);
				}
				
			//	read the position
				CoordWithIndex <number_t, index_t> c;
				for(size_t i = 0; i < 3; ++i)
					c[i] = static_cast<number_t> (atof(tokens[i+1].c_str()));
				c.index = static_cast<index_t>(coordsWithIndex.size());
				coordsWithIndex.push_back(c);
				++numFaceVrts;
			}
			else if(tok.compare("facet") == 0)
			{
				STL_READER_COND_THROW(tokenCount < 5,
						"ERROR while reading from " << filename <<
						": triangle not specified correctly in line " << lineCount);
				
				STL_READER_COND_THROW(tokens[1].compare("normal") != 0,
						"ERROR while reading from " << filename <<
						": Missing normal specifier in line " << lineCount);
				
			//	read the normal
				for(size_t i = 0; i < 3; ++i)
					normalsOut.push_back (static_cast<number_t> (atof(tokens[i+2].c_str())));

				numFaceVrts = 0;
			}
			else if(tok.compare("outer") == 0){
				STL_READER_COND_THROW ((tokenCount < 2) || (tokens[1].compare("loop") != 0),
				    "ERROR while reading from " << filename <<
					": expecting outer loop in line " << lineCount);
			}
			else if(tok.compare("endfacet") == 0){
				STL_READER_COND_THROW(numFaceVrts != 3,
					"ERROR while reading from " << filename <<
					": bad number of vertices specified for face in line " << lineCount);

				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));
			}
			else if(tok.compare("solid") == 0){
				solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));
			}
		}
		lineCount++;
	}

	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}